

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadStructure(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ColladaParser *this_local;
  
  do {
    while( true ) {
      uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) goto LAB_0060f42d;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 != 1) break;
      bVar1 = IsElement(this,"asset");
      if (bVar1) {
        ReadAssetInfo(this);
      }
      else {
        bVar1 = IsElement(this,"library_animations");
        if (bVar1) {
          ReadAnimationLibrary(this);
        }
        else {
          bVar1 = IsElement(this,"library_animation_clips");
          if (bVar1) {
            ReadAnimationClipLibrary(this);
          }
          else {
            bVar1 = IsElement(this,"library_controllers");
            if (bVar1) {
              ReadControllerLibrary(this);
            }
            else {
              bVar1 = IsElement(this,"library_images");
              if (bVar1) {
                ReadImageLibrary(this);
              }
              else {
                bVar1 = IsElement(this,"library_materials");
                if (bVar1) {
                  ReadMaterialLibrary(this);
                }
                else {
                  bVar1 = IsElement(this,"library_effects");
                  if (bVar1) {
                    ReadEffectLibrary(this);
                  }
                  else {
                    bVar1 = IsElement(this,"library_geometries");
                    if (bVar1) {
                      ReadGeometryLibrary(this);
                    }
                    else {
                      bVar1 = IsElement(this,"library_visual_scenes");
                      if (bVar1) {
                        ReadSceneLibrary(this);
                      }
                      else {
                        bVar1 = IsElement(this,"library_lights");
                        if (bVar1) {
                          ReadLightLibrary(this);
                        }
                        else {
                          bVar1 = IsElement(this,"library_cameras");
                          if (bVar1) {
                            ReadCameraLibrary(this);
                          }
                          else {
                            bVar1 = IsElement(this,"library_nodes");
                            if (bVar1) {
                              ReadSceneNode(this,(Node *)0x0);
                            }
                            else {
                              bVar1 = IsElement(this,"scene");
                              if (bVar1) {
                                ReadScene(this);
                              }
                              else {
                                SkipElement(this);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar3 != 2);
LAB_0060f42d:
  PostProcessRootAnimations(this);
  PostProcessControllers(this);
  return;
}

Assistant:

void ColladaParser::ReadStructure()
{
    while (mReader->read())
    {
        // beginning of elements
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("asset"))
                ReadAssetInfo();
            else if (IsElement("library_animations"))
                ReadAnimationLibrary();
            else if (IsElement("library_animation_clips"))
                ReadAnimationClipLibrary();
            else if (IsElement("library_controllers"))
                ReadControllerLibrary();
            else if (IsElement("library_images"))
                ReadImageLibrary();
            else if (IsElement("library_materials"))
                ReadMaterialLibrary();
            else if (IsElement("library_effects"))
                ReadEffectLibrary();
            else if (IsElement("library_geometries"))
                ReadGeometryLibrary();
            else if (IsElement("library_visual_scenes"))
                ReadSceneLibrary();
            else if (IsElement("library_lights"))
                ReadLightLibrary();
            else if (IsElement("library_cameras"))
                ReadCameraLibrary();
            else if (IsElement("library_nodes"))
                ReadSceneNode(NULL); /* some hacking to reuse this piece of code */
            else if (IsElement("scene"))
                ReadScene();
            else
                SkipElement();
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            break;
        }
    }

    PostProcessRootAnimations();
    PostProcessControllers();
}